

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

void getKktFailures(HighsOptions *options,HighsLp *lp,
                   vector<double,_std::allocator<double>_> *gradient,HighsSolution *solution,
                   HighsBasis *basis,HighsInfo *highs_info,HighsPrimalDualErrors *primal_dual_errors
                   ,bool get_residuals)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  double *pdVar6;
  reference pvVar7;
  const_reference pvVar8;
  byte *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int *in_RSI;
  long in_RDI;
  byte *in_R8;
  long in_R9;
  double dVar9;
  double dVar10;
  double dVar11;
  vector<double,_std::allocator<double>_> *pvVar12;
  int *in_stack_00000008;
  byte in_stack_00000010;
  double relative_dual_residual;
  double absolute_dual_residual;
  double term_3;
  HighsInt iCol_2;
  double relative_primal_residual;
  double absolute_primal_residual;
  double term_2;
  HighsInt iRow_3;
  double large_residual_error;
  bool have_values;
  double check_sum_complementarity_violations;
  double check_max_complementarity_violation;
  double complementarity_violation;
  double dual_residual;
  double mid;
  double upper_1;
  double lower_1;
  double dual_1;
  double primal;
  HighsInt iRow_2;
  bool is_col;
  HighsInt iVar_1;
  double primal_residual;
  double term_1;
  double term;
  double Avalue;
  HighsInt iRow_1;
  HighsInt el;
  HighsInt iCol_1;
  double off_bound_nonbasic;
  double abs_basic_dual;
  bool status_value_ok;
  HighsInt iRow;
  HighsInt iCol;
  HighsInt iVar;
  HighsVarType integrality;
  double dual;
  double value;
  double upper;
  double lower;
  double value_residual;
  double dual_infeasibility;
  double relative_primal_infeasibility;
  double absolute_primal_infeasibility;
  HighsBasisStatus *status_pointer;
  HighsBasisStatus status;
  vector<double,_std::allocator<double>_> dual_negative_sum;
  vector<double,_std::allocator<double>_> dual_positive_sum;
  vector<double,_std::allocator<double>_> primal_negative_sum;
  vector<double,_std::allocator<double>_> primal_positive_sum;
  double *sum_off_bound_nonbasic;
  double *max_off_bound_nonbasic;
  HighsInt *num_off_bound_nonbasic;
  double *sum_nonzero_basic_duals;
  double *max_nonzero_basic_dual;
  HighsInt *num_large_nonzero_basic_duals;
  HighsInt *num_nonzero_basic_duals;
  double *sum_dual_residual;
  double *max_relative_dual_residual_value;
  HighsInt *max_relative_dual_residual_index;
  double *max_absolute_dual_residual_value;
  HighsInt *max_absolute_dual_residual_index;
  HighsInt *num_dual_residual;
  double *sum_primal_residual;
  double *max_relative_primal_residual_value;
  HighsInt *max_relative_primal_residual_index;
  double *max_absolute_primal_residual_value;
  HighsInt *max_absolute_primal_residual_index;
  HighsInt *num_primal_residual;
  bool have_integrality;
  bool *have_basis;
  bool *have_dual_solution;
  bool *have_primal_solution;
  double *sum_complementarity_violations;
  double *max_complementarity_violation;
  double *sum_dual_infeasibility;
  double *max_dual_infeasibility_value;
  HighsInt *max_dual_infeasibility_index;
  HighsInt *num_dual_infeasibility;
  double *sum_primal_infeasibility;
  double *max_relative_primal_infeasibility_value;
  HighsInt *max_relative_primal_infeasibility_index;
  double *max_absolute_primal_infeasibility_value;
  HighsInt *max_absolute_primal_infeasibility_index;
  HighsInt *num_primal_infeasibility;
  double dual_feasibility_tolerance;
  double primal_feasibility_tolerance;
  size_type in_stack_fffffffffffffbc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbd0;
  value_type vVar13;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbe0;
  size_type in_stack_fffffffffffffbe8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbf0;
  double *in_stack_fffffffffffffc08;
  double *in_stack_fffffffffffffc10;
  double *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  undefined8 in_stack_fffffffffffffc28;
  HighsBasisStatus *in_stack_fffffffffffffc30;
  double in_stack_fffffffffffffc38;
  double *in_stack_fffffffffffffc40;
  double *in_stack_fffffffffffffc48;
  HighsSolution *in_stack_fffffffffffffc50;
  HighsLp *in_stack_fffffffffffffc58;
  HighsLp *pHVar14;
  HighsLp *in_stack_fffffffffffffc60;
  uint local_35c;
  char *local_350;
  value_type *local_338;
  int local_314;
  int local_2f4;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double *local_2b8;
  double *local_2b0;
  double *local_2a8;
  HighsSolution *local_2a0;
  int local_294;
  byte local_28d;
  int local_28c;
  double local_288;
  HighsLp *local_280;
  double local_278;
  double local_270;
  int local_264;
  int local_260;
  uint local_25c;
  double local_258;
  double local_250;
  undefined1 local_241;
  int local_240;
  uint local_23c;
  uint local_238;
  value_type local_231;
  value_type local_230;
  value_type local_228;
  char *local_220;
  HighsLogOptions *local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  value_type *local_1f0;
  value_type local_1e1 [25];
  undefined8 local_1c8;
  vector<double,_std::allocator<double>_> local_1c0;
  vector<double,_std::allocator<double>_> local_1a8;
  vector<double,_std::allocator<double>_> local_190;
  vector<double,_std::allocator<double>_> local_178;
  double *local_160;
  double *local_158;
  int *local_150;
  double *local_148;
  double *local_140;
  int *local_138;
  int *local_130;
  double *local_128;
  double *local_120;
  int *local_118;
  double *local_110;
  int *local_108;
  int *local_100;
  double *local_f8;
  double *local_f0;
  int *local_e8;
  double *local_e0;
  int *local_d8;
  int *local_d0;
  byte local_c1;
  byte *local_c0;
  byte *local_b8;
  byte *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  double *local_90;
  uint *local_88;
  int *local_80;
  double *local_78;
  double *local_70;
  uint *local_68;
  double *local_60;
  uint *local_58;
  int *local_50;
  double local_48;
  double local_40;
  byte local_31;
  long local_30;
  byte *local_28;
  byte *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  int *local_10;
  long local_8;
  
  local_31 = in_stack_00000010 & 1;
  local_40 = *(double *)(in_RDI + 0x118);
  local_48 = *(double *)(in_RDI + 0x120);
  local_50 = (int *)(in_R9 + 0x58);
  local_58 = (uint *)(in_stack_00000008 + 0x1e);
  local_60 = (double *)(in_R9 + 0x60);
  local_68 = (uint *)(in_stack_00000008 + 0x22);
  local_70 = (double *)(in_stack_00000008 + 0x20);
  local_78 = (double *)(in_R9 + 0x68);
  local_80 = (int *)(in_R9 + 0x70);
  local_88 = (uint *)(in_stack_00000008 + 0x2e);
  local_90 = (double *)(in_R9 + 0x78);
  local_98 = (double *)(in_R9 + 0x80);
  local_a0 = (double *)(in_R9 + 0x88);
  local_a8 = (double *)(in_R9 + 0x90);
  *local_50 = -1;
  *local_60 = INFINITY;
  *local_78 = INFINITY;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  HighsError::invalidate((HighsError *)(in_stack_00000008 + 0x1c));
  *(undefined4 *)(local_30 + 0x2c) = 0;
  *local_80 = -1;
  *local_90 = INFINITY;
  *local_98 = INFINITY;
  HighsError::invalidate((HighsError *)(in_stack_00000008 + 0x2c));
  *(undefined4 *)(local_30 + 0x30) = 0;
  *local_a0 = INFINITY;
  *local_a8 = INFINITY;
  local_b0 = local_20;
  local_b8 = local_20 + 1;
  local_c0 = local_28;
  sVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(local_10 + 0x5e));
  local_c1 = sVar2 != 0;
  if ((*local_b0 & 1) != 0) {
    *local_50 = 0;
    *local_60 = 0.0;
    *local_78 = 0.0;
    HighsError::reset((HighsError *)(in_stack_00000008 + 0x1c));
    if ((*local_b8 & 1) != 0) {
      *local_80 = 0;
      *local_90 = 0.0;
      *local_98 = 0.0;
      HighsError::reset((HighsError *)(in_stack_00000008 + 0x2c));
    }
  }
  local_d0 = in_stack_00000008 + 0xc;
  local_d8 = in_stack_00000008 + 0x16;
  local_e0 = (double *)(in_stack_00000008 + 0x14);
  local_e8 = in_stack_00000008 + 0x1a;
  local_f0 = (double *)(in_stack_00000008 + 0x18);
  local_f8 = (double *)(in_stack_00000008 + 0xe);
  local_100 = in_stack_00000008 + 0x10;
  local_108 = in_stack_00000008 + 0x26;
  local_110 = (double *)(in_stack_00000008 + 0x24);
  local_118 = in_stack_00000008 + 0x2a;
  local_120 = (double *)(in_stack_00000008 + 0x28);
  local_128 = (double *)(in_stack_00000008 + 0x12);
  local_130 = in_stack_00000008;
  local_138 = in_stack_00000008 + 1;
  local_140 = (double *)(in_stack_00000008 + 2);
  local_148 = (double *)(in_stack_00000008 + 4);
  local_150 = in_stack_00000008 + 6;
  local_158 = (double *)(in_stack_00000008 + 8);
  local_160 = (double *)(in_stack_00000008 + 10);
  if (((*local_b0 & 1) == 0) || ((local_31 & 1) == 0)) {
    *local_d0 = -1;
    *local_e0 = INFINITY;
    *local_f8 = INFINITY;
    HighsError::invalidate((HighsError *)(in_stack_00000008 + 0x14));
  }
  else {
    *local_d0 = 0;
    *local_e0 = 0.0;
    *local_f8 = 0.0;
    HighsError::reset((HighsError *)(in_stack_00000008 + 0x14));
  }
  if (((*local_b8 & 1) == 0) || ((local_31 & 1) == 0)) {
    *local_100 = -1;
    *local_110 = INFINITY;
    *local_128 = INFINITY;
    HighsError::invalidate((HighsError *)(in_stack_00000008 + 0x24));
  }
  else {
    *local_100 = 0;
    *local_110 = 0.0;
    *local_128 = 0.0;
    HighsError::reset((HighsError *)(in_stack_00000008 + 0x24));
  }
  if ((*local_c0 & 1) == 0) {
    *local_130 = -1;
    *local_138 = -1;
    *local_140 = INFINITY;
    *local_148 = INFINITY;
    *local_150 = -1;
    *local_158 = INFINITY;
    *local_160 = INFINITY;
  }
  else {
    *local_130 = 0;
    *local_138 = 0;
    *local_140 = 0.0;
    *local_148 = 0.0;
    *local_150 = 0;
    *local_158 = 0.0;
    *local_160 = 0.0;
  }
  if ((*local_b0 & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x5237a9);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x5237b6);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x5237c3);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x5237d0);
    if ((local_31 & 1) != 0) {
      local_1c8 = 0;
      std::vector<double,_std::allocator<double>_>::assign
                (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 (value_type_conflict1 *)0x52380b);
      local_1e1[1] = kLower;
      local_1e1[2] = kLower;
      local_1e1[3] = kLower;
      local_1e1[4] = kLower;
      local_1e1[5] = kLower;
      local_1e1[6] = kLower;
      local_1e1[7] = kLower;
      local_1e1[8] = kLower;
      std::vector<double,_std::allocator<double>_>::assign
                (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 (value_type_conflict1 *)0x52383a);
      if ((*local_b8 & 1) != 0) {
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      }
    }
    local_1e1[0] = kNonbasic;
    if ((*local_c0 & 1) == 0) {
      local_338 = (value_type *)0x0;
    }
    else {
      local_338 = local_1e1;
    }
    local_1f0 = local_338;
    local_230 = 0.0;
    local_231 = kContinuous;
    for (local_238 = 0; (int)local_238 < *local_10 + local_10[1]; local_238 = local_238 + 1) {
      if ((int)local_238 < *local_10) {
        local_23c = local_238;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                            (long)(int)local_238);
        local_218 = (HighsLogOptions *)*pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                            (long)(int)local_23c);
        local_220 = (char *)*pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 8),
                            (long)(int)local_23c);
        local_228 = *pvVar3;
        if ((*local_b8 & 1) != 0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                              (long)(int)local_23c);
          local_230 = *pvVar3;
        }
        if ((*local_c0 & 1) != 0) {
          pvVar4 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_28 + 0x30),(long)(int)local_23c);
          local_1e1[0] = *pvVar4;
        }
        if ((local_c1 & 1) != 0) {
          pvVar5 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                              (local_10 + 0x5e),(long)(int)local_23c);
          local_231 = *pvVar5;
        }
      }
      else {
        local_240 = local_238 - *local_10;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                            (long)local_240);
        local_218 = (HighsLogOptions *)*pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                            (long)local_240);
        local_220 = (char *)*pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x38),
                            (long)local_240);
        local_228 = *pvVar3;
        if ((*local_b8 & 1) != 0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x50),
                              (long)local_240);
          local_230 = *pvVar3;
        }
        if ((*local_c0 & 1) != 0) {
          pvVar4 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_28 + 0x48),(long)local_240);
          local_1e1[0] = *pvVar4;
        }
        local_231 = kContinuous;
      }
      local_230 = local_230 * (double)local_10[0x3c];
      local_241 = getVariableKktFailures
                            ((double)in_stack_fffffffffffffc60,(double)in_stack_fffffffffffffc58,
                             (double)in_stack_fffffffffffffc50,(double)in_stack_fffffffffffffc48,
                             (double)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                             in_stack_fffffffffffffc30,
                             (HighsVarType)((ulong)in_stack_fffffffffffffc28 >> 0x38),
                             (double *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20)
                             ,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                             in_stack_fffffffffffffc08);
      if (!(bool)local_241) {
        if ((int)local_238 < *local_10) {
          local_350 = "Column";
        }
        else {
          local_350 = "Row   ";
        }
        if ((int)local_238 < *local_10) {
          local_35c = local_238;
        }
        else {
          local_35c = local_238 - *local_10;
        }
        highsLogUser(local_218,SUB84(local_228,0),local_220,local_210,local_8 + 0x380,5,
                     "getKktFailures: %s %d status-value error: [%23.18g; %23.18g; %23.18g] has residual %g\n"
                     ,local_350,(ulong)local_35c);
      }
      if (local_40 < local_1f8) {
        *local_50 = *local_50 + 1;
      }
      if (*local_60 < local_1f8) {
        *local_58 = local_238;
        *local_60 = local_1f8;
      }
      if (*local_70 < local_200) {
        *local_68 = local_238;
        *local_70 = local_200;
      }
      *local_78 = local_1f8 + *local_78;
      if ((*local_b8 & 1) != 0) {
        if (local_48 < local_208) {
          *local_80 = *local_80 + 1;
        }
        if (*local_90 < local_208) {
          *local_90 = local_208;
          *local_88 = local_238;
        }
        *local_98 = local_208 + *local_98;
      }
      if ((*local_c0 & 1) != 0) {
        if (local_1e1[0] == kBasic) {
          local_250 = local_208;
          if (0.0 < local_208) {
            *local_130 = *local_130 + 1;
            if (local_48 < local_208) {
              *local_138 = *local_138 + 1;
            }
            pdVar6 = std::max<double>(&local_250,local_140);
            *local_140 = *pdVar6;
            *local_148 = local_250 + *local_148;
          }
        }
        else {
          local_258 = local_210;
          if (0.0 < local_210) {
            *local_150 = *local_150 + 1;
          }
          pdVar6 = std::max<double>(&local_258,local_158);
          *local_158 = *pdVar6;
          *local_160 = local_258 + *local_160;
        }
      }
      if (((int)local_238 < *local_10) && ((local_31 & 1) != 0)) {
        local_25c = local_238;
        if ((*local_b8 & 1) != 0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_18,(long)(int)local_238);
          if (*pvVar3 <= 0.0) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)(int)local_25c);
            vVar13 = *pvVar3;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_1c0,(long)(int)local_25c);
            *pvVar7 = -vVar13;
          }
          else {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)(int)local_25c);
            vVar13 = *pvVar3;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_1a8,(long)(int)local_25c);
            *pvVar7 = vVar13;
          }
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),
                            (long)(int)local_25c);
        for (local_260 = *pvVar8; iVar1 = local_260,
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),
                                (long)(int)(local_25c + 1)), iVar1 < *pvVar8;
            local_260 = local_260 + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_10 + 0x30),(long)local_260
                             );
          local_264 = *pvVar8;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x36),
                              (long)local_260);
          local_270 = *pvVar3;
          dVar9 = local_228 * local_270;
          local_278 = dVar9;
          if (dVar9 <= 0.0) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_190,(long)local_264);
            *pvVar7 = *pvVar7 - dVar9;
            pHVar14 = in_stack_fffffffffffffc58;
          }
          else {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_178,(long)local_264);
            *pvVar7 = dVar9 + *pvVar7;
            pHVar14 = in_stack_fffffffffffffc58;
          }
          in_stack_fffffffffffffc58 = pHVar14;
          if ((*local_b8 & 1) != 0) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_20 + 0x50),
                                (long)local_264);
            in_stack_fffffffffffffc58 = (HighsLp *)(-*pvVar3 * local_270);
            local_280 = in_stack_fffffffffffffc58;
            if ((double)in_stack_fffffffffffffc58 <= 0.0) {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_1c0,(long)(int)local_25c);
              *pvVar7 = *pvVar7 - (double)in_stack_fffffffffffffc58;
            }
            else {
              in_stack_fffffffffffffc60 = in_stack_fffffffffffffc58;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_1a8,(long)(int)local_25c);
              *pvVar7 = (double)in_stack_fffffffffffffc60 + *pvVar7;
              in_stack_fffffffffffffc58 = pHVar14;
            }
          }
        }
      }
    }
    if ((*local_b8 & 1) != 0) {
      *local_a0 = 0.0;
      *local_a8 = 0.0;
      local_288 = 0.0;
      for (local_28c = 0; local_28c < *local_10 + local_10[1]; local_28c = local_28c + 1) {
        local_28d = local_28c < *local_10;
        local_294 = local_28c - *local_10;
        if ((bool)local_28d) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 8),
                              (long)local_28c);
          in_stack_fffffffffffffc50 = (HighsSolution *)*pvVar3;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x38),
                              (long)local_294);
          in_stack_fffffffffffffc50 = (HighsSolution *)*pvVar3;
        }
        local_2a0 = in_stack_fffffffffffffc50;
        if ((local_28d & 1) == 0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x50),
                              (long)local_294);
          in_stack_fffffffffffffc48 = (double *)*pvVar3;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                              (long)local_28c);
          in_stack_fffffffffffffc48 = (double *)*pvVar3;
        }
        local_2a8 = in_stack_fffffffffffffc48;
        if ((local_28d & 1) == 0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                              (long)local_294);
          in_stack_fffffffffffffc40 = (double *)*pvVar3;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                              (long)local_28c);
          in_stack_fffffffffffffc40 = (double *)*pvVar3;
        }
        local_2b0 = in_stack_fffffffffffffc40;
        if ((local_28d & 1) == 0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                              (long)local_294);
          local_2b8 = (double *)*pvVar3;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                              (long)local_28c);
          local_2b8 = (double *)*pvVar3;
        }
        if ((-INFINITY < (double)local_2b0) || ((double)local_2b8 < INFINITY)) {
          local_2c0 = ((double)local_2b0 + (double)local_2b8) * 0.5;
          pdVar6 = local_2b8;
          if ((double)local_2a0 < local_2c0) {
            pdVar6 = local_2b0;
          }
          local_288 = ABS((double)pdVar6 - (double)local_2a0);
        }
        else {
          local_288 = 1.0;
        }
        local_2c8 = ABS((double)local_2a8);
        local_2d0 = local_288 * local_2c8;
        *local_a8 = *local_a8 + local_2d0;
        pdVar6 = std::max<double>(&local_2d0,local_a0);
        *local_a0 = *pdVar6;
      }
      getComplementarityViolations
                (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                 in_stack_fffffffffffffc40);
    }
    if ((local_31 & 1) != 0) {
      for (local_2f4 = 0; local_2f4 < local_10[1]; local_2f4 = local_2f4 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x38),
                            (long)local_2f4);
        dVar9 = -*pvVar3;
        if (dVar9 <= 0.0) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_190,(long)local_2f4);
          *pvVar7 = *pvVar7 - dVar9;
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_178,(long)local_2f4);
          *pvVar7 = dVar9 + *pvVar7;
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_178,(long)local_2f4);
        dVar9 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_190,(long)local_2f4);
        dVar10 = ABS(dVar9 - *pvVar7);
        dVar11 = dVar10;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_178,(long)local_2f4);
        dVar9 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_190,(long)local_2f4);
        dVar11 = dVar11 / (dVar9 + 1.0 + *pvVar7);
        if (1e-12 < dVar10) {
          *local_d0 = *local_d0 + 1;
        }
        if (*local_e0 < dVar10) {
          *local_e0 = dVar10;
          *local_d8 = local_2f4;
        }
        if (*local_f0 < dVar11) {
          *local_f0 = dVar11;
          *local_e8 = local_2f4;
        }
        *local_f8 = dVar10 + *local_f8;
      }
      if ((*local_b8 & 1) != 0) {
        for (local_314 = 0; local_314 < *local_10; local_314 = local_314 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                              (long)local_314);
          dVar9 = -*pvVar3;
          if (dVar9 <= 0.0) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_1c0,(long)local_314);
            *pvVar7 = *pvVar7 - dVar9;
          }
          else {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_1a8,(long)local_314);
            *pvVar7 = dVar9 + *pvVar7;
          }
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_1a8,(long)local_314);
          vVar13 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_1c0,(long)local_314);
          pvVar12 = (vector<double,_std::allocator<double>_> *)ABS(vVar13 - *pvVar7);
          in_stack_fffffffffffffbe0 = pvVar12;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_1a8,(long)local_314);
          dVar9 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_1c0,(long)local_314);
          dVar9 = (double)in_stack_fffffffffffffbe0 / (dVar9 + 1.0 + *pvVar7);
          if (1e-12 < (double)pvVar12) {
            *local_100 = *local_100 + 1;
          }
          if (*local_110 < (double)pvVar12) {
            *local_110 = (double)pvVar12;
            *local_108 = local_314;
          }
          if (*local_120 < dVar9) {
            *local_120 = dVar9;
            *local_118 = local_314;
          }
          *local_128 = (double)pvVar12 + *local_128;
        }
      }
    }
    if (*local_50 == 0) {
      *(undefined4 *)(local_30 + 0x2c) = 2;
    }
    else {
      *(undefined4 *)(local_30 + 0x2c) = 1;
    }
    if ((*local_b8 & 1) != 0) {
      if (*local_80 == 0) {
        *(undefined4 *)(local_30 + 0x30) = 2;
      }
      else {
        *(undefined4 *)(local_30 + 0x30) = 1;
      }
    }
    *(undefined8 *)(in_stack_00000008 + 0x1c) = *(undefined8 *)(local_30 + 0x60);
    *(undefined8 *)(in_stack_00000008 + 0x2c) = *(undefined8 *)(local_30 + 0x78);
    *(undefined8 *)(in_stack_00000008 + 0x30) = *(undefined8 *)(in_stack_00000008 + 0x2c);
    in_stack_00000008[0x32] = in_stack_00000008[0x2e];
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffbe0);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffbe0);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffbe0);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffbe0);
  }
  return;
}

Assistant:

void getKktFailures(const HighsOptions& options, const HighsLp& lp,
                    const std::vector<double>& gradient,
                    const HighsSolution& solution, const HighsBasis& basis,
                    HighsInfo& highs_info,
                    HighsPrimalDualErrors& primal_dual_errors,
                    const bool get_residuals) {
  double primal_feasibility_tolerance = options.primal_feasibility_tolerance;
  double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  // highs_info are the values computed in this method.

  HighsInt& num_primal_infeasibility = highs_info.num_primal_infeasibilities;

  HighsInt& max_absolute_primal_infeasibility_index =
      primal_dual_errors.max_primal_infeasibility.absolute_index;
  double& max_absolute_primal_infeasibility_value =
      highs_info.max_primal_infeasibility;
  HighsInt& max_relative_primal_infeasibility_index =
      primal_dual_errors.max_primal_infeasibility.relative_index;
  double& max_relative_primal_infeasibility_value =
      primal_dual_errors.max_primal_infeasibility.relative_value;

  double& sum_primal_infeasibility = highs_info.sum_primal_infeasibilities;

  HighsInt& num_dual_infeasibility = highs_info.num_dual_infeasibilities;

  HighsInt& max_dual_infeasibility_index =
      primal_dual_errors.max_dual_infeasibility.absolute_index;
  double& max_dual_infeasibility_value = highs_info.max_dual_infeasibility;

  double& sum_dual_infeasibility = highs_info.sum_dual_infeasibilities;

  double& max_complementarity_violation =
      highs_info.max_complementarity_violation;
  double& sum_complementarity_violations =
      highs_info.sum_complementarity_violations;

  num_primal_infeasibility = kHighsIllegalInfeasibilityCount;
  max_absolute_primal_infeasibility_value = kHighsIllegalInfeasibilityMeasure;
  sum_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  primal_dual_errors.max_primal_infeasibility.invalidate();
  highs_info.primal_solution_status = kSolutionStatusNone;

  num_dual_infeasibility = kHighsIllegalInfeasibilityCount;
  max_dual_infeasibility_value = kHighsIllegalInfeasibilityMeasure;
  sum_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;

  primal_dual_errors.max_dual_infeasibility.invalidate();
  highs_info.dual_solution_status = kSolutionStatusNone;

  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;

  const bool& have_primal_solution = solution.value_valid;
  const bool& have_dual_solution = solution.dual_valid;
  const bool& have_basis = basis.valid;
  const bool have_integrality = (lp.integrality_.size() != 0);
  // Check that there is no dual solution if there's no primal solution
  assert(have_primal_solution || !have_dual_solution);
  // Check that there is no basis if there's no dual solution
  assert(have_dual_solution || !have_basis);

  if (have_primal_solution) {
    // There's a primal solution, so check its size and initialise the
    // infeasibility counts
    assert((int)solution.col_value.size() >= lp.num_col_);
    assert((int)solution.row_value.size() >= lp.num_row_);
    num_primal_infeasibility = 0;
    max_absolute_primal_infeasibility_value = 0;
    sum_primal_infeasibility = 0;
    primal_dual_errors.max_primal_infeasibility.reset();
    if (have_dual_solution) {
      // There's a dual solution, so check its size and initialise the
      // infeasibility counts
      assert((int)solution.col_dual.size() >= lp.num_col_);
      assert((int)solution.row_dual.size() >= lp.num_row_);
      num_dual_infeasibility = 0;
      max_dual_infeasibility_value = 0;
      sum_dual_infeasibility = 0;
      primal_dual_errors.max_dual_infeasibility.reset();
    }
  }

  HighsInt& num_primal_residual = primal_dual_errors.num_primal_residual;

  HighsInt& max_absolute_primal_residual_index =
      primal_dual_errors.max_primal_residual.absolute_index;
  double& max_absolute_primal_residual_value =
      primal_dual_errors.max_primal_residual.absolute_value;
  HighsInt& max_relative_primal_residual_index =
      primal_dual_errors.max_primal_residual.relative_index;
  double& max_relative_primal_residual_value =
      primal_dual_errors.max_primal_residual.relative_value;

  double& sum_primal_residual = primal_dual_errors.sum_primal_residual;

  HighsInt& num_dual_residual = primal_dual_errors.num_dual_residual;

  HighsInt& max_absolute_dual_residual_index =
      primal_dual_errors.max_dual_residual.absolute_index;
  double& max_absolute_dual_residual_value =
      primal_dual_errors.max_dual_residual.absolute_value;
  HighsInt& max_relative_dual_residual_index =
      primal_dual_errors.max_dual_residual.relative_index;
  double& max_relative_dual_residual_value =
      primal_dual_errors.max_dual_residual.relative_value;

  double& sum_dual_residual = primal_dual_errors.sum_dual_residual;

  HighsInt& num_nonzero_basic_duals =
      primal_dual_errors.num_nonzero_basic_duals;
  HighsInt& num_large_nonzero_basic_duals =
      primal_dual_errors.num_large_nonzero_basic_duals;
  double& max_nonzero_basic_dual = primal_dual_errors.max_nonzero_basic_dual;
  double& sum_nonzero_basic_duals = primal_dual_errors.sum_nonzero_basic_duals;

  HighsInt& num_off_bound_nonbasic = primal_dual_errors.num_off_bound_nonbasic;
  double& max_off_bound_nonbasic = primal_dual_errors.max_off_bound_nonbasic;
  double& sum_off_bound_nonbasic = primal_dual_errors.sum_off_bound_nonbasic;

  // Initialise HighsPrimalDualErrors

  if (have_primal_solution && get_residuals) {
    num_primal_residual = 0;
    max_absolute_primal_residual_value = 0;
    sum_primal_residual = 0;
    primal_dual_errors.max_primal_residual.reset();
  } else {
    num_primal_residual = kHighsIllegalInfeasibilityCount;
    max_absolute_primal_residual_value = kHighsIllegalInfeasibilityMeasure;
    sum_primal_residual = kHighsIllegalInfeasibilityMeasure;
    primal_dual_errors.max_primal_residual.invalidate();
  }
  if (have_dual_solution && get_residuals) {
    num_dual_residual = 0;
    max_absolute_dual_residual_value = 0;
    sum_dual_residual = 0;
    primal_dual_errors.max_dual_residual.reset();
  } else {
    num_dual_residual = kHighsIllegalInfeasibilityCount;
    max_absolute_dual_residual_value = kHighsIllegalInfeasibilityMeasure;
    sum_dual_residual = kHighsIllegalInfeasibilityMeasure;
    primal_dual_errors.max_dual_residual.invalidate();
  }
  if (have_basis) {
    num_nonzero_basic_duals = 0;
    num_large_nonzero_basic_duals = 0;
    max_nonzero_basic_dual = 0;
    sum_nonzero_basic_duals = 0;

    num_off_bound_nonbasic = 0;
    max_off_bound_nonbasic = 0;
    sum_off_bound_nonbasic = 0;
  } else {
    num_nonzero_basic_duals = kHighsIllegalInfeasibilityCount;
    num_large_nonzero_basic_duals = kHighsIllegalInfeasibilityCount;
    max_nonzero_basic_dual = kHighsIllegalInfeasibilityMeasure;
    sum_nonzero_basic_duals = kHighsIllegalInfeasibilityMeasure;

    num_off_bound_nonbasic = kHighsIllegalInfeasibilityCount;
    max_off_bound_nonbasic = kHighsIllegalInfeasibilityMeasure;
    sum_off_bound_nonbasic = kHighsIllegalInfeasibilityMeasure;
  }

  // Without a primal solution, nothing can be done!
  if (!have_primal_solution) return;
  std::vector<double> primal_positive_sum;
  std::vector<double> primal_negative_sum;
  std::vector<double> dual_positive_sum;
  std::vector<double> dual_negative_sum;
  if (get_residuals) {
    primal_positive_sum.assign(lp.num_row_, 0);
    primal_negative_sum.assign(lp.num_row_, 0);
    if (have_dual_solution) {
      dual_positive_sum.resize(lp.num_col_);
      dual_negative_sum.resize(lp.num_col_);
    }
  }

  // Set status to a value so the compiler doesn't think it might be unassigned.
  HighsBasisStatus status = HighsBasisStatus::kNonbasic;
  // Set status_pointer to be NULL unless we have a basis, in which
  // case it's the pointer to status. Can't make it a pointer to the
  // entry of basis since this is const.
  const HighsBasisStatus* status_pointer = have_basis ? &status : NULL;

  double absolute_primal_infeasibility;
  double relative_primal_infeasibility;
  double dual_infeasibility;
  double value_residual;
  double lower;
  double upper;
  double value;
  double dual = 0;
  HighsVarType integrality = HighsVarType::kContinuous;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    if (iVar < lp.num_col_) {
      HighsInt iCol = iVar;
      lower = lp.col_lower_[iCol];
      upper = lp.col_upper_[iCol];
      value = solution.col_value[iCol];
      if (have_dual_solution) dual = solution.col_dual[iCol];
      if (have_basis) status = basis.col_status[iCol];
      if (have_integrality) integrality = lp.integrality_[iCol];
    } else {
      HighsInt iRow = iVar - lp.num_col_;
      lower = lp.row_lower_[iRow];
      upper = lp.row_upper_[iRow];
      value = solution.row_value[iRow];
      // @FlipRowDual -solution.row_dual[iRow]; became solution.row_dual[iRow];
      if (have_dual_solution) dual = solution.row_dual[iRow];
      if (have_basis) status = basis.row_status[iRow];
      integrality = HighsVarType::kContinuous;
    }
    // Flip dual according to lp.sense_
    dual *= (HighsInt)lp.sense_;

    const bool status_value_ok = getVariableKktFailures(
        primal_feasibility_tolerance, dual_feasibility_tolerance, lower, upper,
        value, dual, status_pointer, integrality, absolute_primal_infeasibility,
        relative_primal_infeasibility, dual_infeasibility, value_residual);
    if (!status_value_ok)
      highsLogUser(options.log_options, HighsLogType::kError,
                   "getKktFailures: %s %d status-value error: [%23.18g; "
                   "%23.18g; %23.18g] has "
                   "residual %g\n",
                   iVar < lp.num_col_ ? "Column" : "Row   ",
                   iVar < lp.num_col_ ? int(iVar) : int(iVar - lp.num_col_),
                   lower, value, upper, value_residual);
    assert(status_value_ok);
    // Accumulate primal infeasibilities
    if (absolute_primal_infeasibility > primal_feasibility_tolerance)
      num_primal_infeasibility++;
    if (max_absolute_primal_infeasibility_value <
        absolute_primal_infeasibility) {
      max_absolute_primal_infeasibility_index = iVar;
      max_absolute_primal_infeasibility_value = absolute_primal_infeasibility;
    }
    if (max_relative_primal_infeasibility_value <
        relative_primal_infeasibility) {
      max_relative_primal_infeasibility_index = iVar;
      max_relative_primal_infeasibility_value = relative_primal_infeasibility;
    }
    sum_primal_infeasibility += absolute_primal_infeasibility;

    if (have_dual_solution) {
      // Accumulate dual infeasibilities
      if (dual_infeasibility > dual_feasibility_tolerance)
        num_dual_infeasibility++;
      if (max_dual_infeasibility_value < dual_infeasibility) {
        max_dual_infeasibility_value = dual_infeasibility;
        max_dual_infeasibility_index = iVar;
      }
      sum_dual_infeasibility += dual_infeasibility;
    }
    if (have_basis) {
      if (status == HighsBasisStatus::kBasic) {
        double abs_basic_dual = dual_infeasibility;
        if (abs_basic_dual > 0) {
          num_nonzero_basic_duals++;
          if (abs_basic_dual > dual_feasibility_tolerance)
            num_large_nonzero_basic_duals++;
          max_nonzero_basic_dual =
              std::max(abs_basic_dual, max_nonzero_basic_dual);
          sum_nonzero_basic_duals += abs_basic_dual;
        }
      } else {
        double off_bound_nonbasic = value_residual;
        if (off_bound_nonbasic > 0) num_off_bound_nonbasic++;
        max_off_bound_nonbasic =
            std::max(off_bound_nonbasic, max_off_bound_nonbasic);
        sum_off_bound_nonbasic += off_bound_nonbasic;
      }
    }
    if (iVar < lp.num_col_ && get_residuals) {
      HighsInt iCol = iVar;
      if (have_dual_solution) {
        if (gradient[iCol] > 0) {
          dual_positive_sum[iCol] = gradient[iCol];
        } else {
          dual_negative_sum[iCol] = -gradient[iCol];
        }
      }
      for (HighsInt el = lp.a_matrix_.start_[iCol];
           el < lp.a_matrix_.start_[iCol + 1]; el++) {
        HighsInt iRow = lp.a_matrix_.index_[el];
        double Avalue = lp.a_matrix_.value_[el];
        double term = value * Avalue;
        if (term > 0) {
          primal_positive_sum[iRow] += term;
        } else {
          primal_negative_sum[iRow] -= term;
        }
        // @FlipRowDual += became -=
        if (have_dual_solution) {
          double term = -solution.row_dual[iRow] * Avalue;
          if (term > 0) {
            dual_positive_sum[iCol] += term;
          } else {
            dual_negative_sum[iCol] -= term;
          }
        }
      }
    }
  }

  if (have_dual_solution) {
    // Determine the sum of complementarity violations
    max_complementarity_violation = 0;
    sum_complementarity_violations = 0;
    double primal_residual = 0;
    for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
      const bool is_col = iVar < lp.num_col_;
      const HighsInt iRow = iVar - lp.num_col_;
      const double primal =
          is_col ? solution.col_value[iVar] : solution.row_value[iRow];
      const double dual =
          is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
      const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
      const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
      if (lower <= -kHighsInf && upper >= kHighsInf) {
        // Free
        primal_residual = 1;
      } else {
        const double mid = (lower + upper) * 0.5;
        primal_residual = primal < mid ? std::fabs(lower - primal)
                                       : std::fabs(upper - primal);
      }
      const double dual_residual = std::fabs(dual);
      const double complementarity_violation = primal_residual * dual_residual;
      sum_complementarity_violations += complementarity_violation;
      max_complementarity_violation =
          std::max(complementarity_violation, max_complementarity_violation);
    }
    double check_max_complementarity_violation;
    double check_sum_complementarity_violations;
    const bool have_values = getComplementarityViolations(
        lp, solution, check_max_complementarity_violation,
        check_sum_complementarity_violations);
    assert(have_values);
    assert(check_max_complementarity_violation ==
           max_complementarity_violation);
    assert(check_sum_complementarity_violations ==
           sum_complementarity_violations);
  }

  if (get_residuals) {
    const double large_residual_error = 1e-12;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
      double term = -solution.row_value[iRow];
      if (term > 0) {
        primal_positive_sum[iRow] += term;
      } else {
        primal_negative_sum[iRow] -= term;
      }
      assert(primal_positive_sum[iRow] >= 0);
      assert(primal_negative_sum[iRow] >= 0);
      double absolute_primal_residual =
          std::fabs(primal_positive_sum[iRow] - primal_negative_sum[iRow]);
      double relative_primal_residual =
          absolute_primal_residual /
          (1 + primal_positive_sum[iRow] + primal_negative_sum[iRow]);

      if (absolute_primal_residual > large_residual_error)
        num_primal_residual++;
      if (max_absolute_primal_residual_value < absolute_primal_residual) {
        max_absolute_primal_residual_value = absolute_primal_residual;
        max_absolute_primal_residual_index = iRow;
      }
      if (max_relative_primal_residual_value < relative_primal_residual) {
        max_relative_primal_residual_value = relative_primal_residual;
        max_relative_primal_residual_index = iRow;
      }
      sum_primal_residual += absolute_primal_residual;
    }
    if (have_dual_solution) {
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        double term = -solution.col_dual[iCol];
        if (term > 0) {
          dual_positive_sum[iCol] += term;
        } else {
          dual_negative_sum[iCol] -= term;
        }
        assert(dual_positive_sum[iCol] >= 0);
        assert(dual_negative_sum[iCol] >= 0);
        double absolute_dual_residual =
            std::fabs(dual_positive_sum[iCol] - dual_negative_sum[iCol]);
        double relative_dual_residual =
            absolute_dual_residual /
            (1 + dual_positive_sum[iCol] + dual_negative_sum[iCol]);
        if (absolute_dual_residual > large_residual_error) num_dual_residual++;
        if (max_absolute_dual_residual_value < absolute_dual_residual) {
          max_absolute_dual_residual_value = absolute_dual_residual;
          max_absolute_dual_residual_index = iCol;
        }
        if (max_relative_dual_residual_value < relative_dual_residual) {
          max_relative_dual_residual_value = relative_dual_residual;
          max_relative_dual_residual_index = iCol;
        }
        sum_dual_residual += absolute_dual_residual;
      }
    }
  }
  // Assign primal solution status
  if (num_primal_infeasibility) {
    highs_info.primal_solution_status = kSolutionStatusInfeasible;
  } else {
    highs_info.primal_solution_status = kSolutionStatusFeasible;
  }
  if (have_dual_solution) {
    // Assign dual solution status
    if (num_dual_infeasibility) {
      highs_info.dual_solution_status = kSolutionStatusInfeasible;
    } else {
      highs_info.dual_solution_status = kSolutionStatusFeasible;
    }
  }
  // Assign the two entries in primal_dual_errors that are accumulated
  // in highs_info
  primal_dual_errors.max_primal_infeasibility.absolute_value =
      highs_info.max_primal_infeasibility;
  ;
  primal_dual_errors.max_dual_infeasibility.absolute_value =
      highs_info.max_dual_infeasibility;
  // Relative dual_infeasibility data is the same as absolute
  primal_dual_errors.max_dual_infeasibility.relative_value =
      primal_dual_errors.max_dual_infeasibility.absolute_value;
  primal_dual_errors.max_dual_infeasibility.relative_index =
      primal_dual_errors.max_dual_infeasibility.absolute_index;
}